

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

SUNMatrix SUNSparseFromDenseMatrix(SUNMatrix Ad,sunrealtype droptol,int sparsetype)

{
  long lVar1;
  SUNMatrix p_Var2;
  long lVar3;
  int in_ESI;
  long *in_RDI;
  double in_XMM0_Qa;
  SUNMatrix As;
  sunindextype N;
  sunindextype M;
  sunindextype nnz;
  sunindextype j;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  SUNContext_conflict sunctx;
  long lVar4;
  long lVar5;
  long in_stack_ffffffffffffffd8;
  long lVar6;
  
  sunctx = *(SUNContext_conflict *)*in_RDI;
  lVar1 = *(long *)(*in_RDI + 8);
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < lVar1; lVar5 = lVar5 + 1) {
    for (in_stack_ffffffffffffffd8 = 0; in_stack_ffffffffffffffd8 < (long)sunctx;
        in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 + 1) {
      lVar4 = (int)(uint)(in_XMM0_Qa <
                         ABS(*(double *)
                              (*(long *)(*(long *)(*in_RDI + 0x20) + lVar5 * 8) +
                              in_stack_ffffffffffffffd8 * 8))) + lVar4;
    }
  }
  p_Var2 = SUNSparseMatrix(in_RDI[2],in_stack_ffffffffffffffd8,lVar5,(int)((ulong)lVar4 >> 0x20),
                           sunctx);
  lVar4 = 0;
  if (in_ESI == 0) {
    for (lVar5 = 0; lVar5 < lVar1; lVar5 = lVar5 + 1) {
      *(long *)(*(long *)((long)p_Var2->content + 0x38) + lVar5 * 8) = lVar4;
      for (lVar6 = 0; lVar6 < (long)sunctx; lVar6 = lVar6 + 1) {
        lVar3 = lVar4;
        if (in_XMM0_Qa <
            ABS(*(double *)(*(long *)(*(long *)(*in_RDI + 0x20) + lVar5 * 8) + lVar6 * 8))) {
          *(long *)(*(long *)((long)p_Var2->content + 0x30) + lVar4 * 8) = lVar6;
          lVar3 = lVar4 + 1;
          *(undefined8 *)(*(long *)((long)p_Var2->content + 0x20) + lVar4 * 8) =
               *(undefined8 *)(*(long *)(*(long *)(*in_RDI + 0x20) + lVar5 * 8) + lVar6 * 8);
        }
        lVar4 = lVar3;
      }
    }
    *(long *)(*(long *)((long)p_Var2->content + 0x38) + lVar1 * 8) = lVar4;
  }
  else {
    for (lVar5 = 0; lVar5 < (long)sunctx; lVar5 = lVar5 + 1) {
      *(long *)(*(long *)((long)p_Var2->content + 0x38) + lVar5 * 8) = lVar4;
      for (lVar6 = 0; lVar6 < lVar1; lVar6 = lVar6 + 1) {
        lVar3 = lVar4;
        if (in_XMM0_Qa <
            ABS(*(double *)(*(long *)(*(long *)(*in_RDI + 0x20) + lVar6 * 8) + lVar5 * 8))) {
          *(long *)(*(long *)((long)p_Var2->content + 0x30) + lVar4 * 8) = lVar6;
          lVar3 = lVar4 + 1;
          *(undefined8 *)(*(long *)((long)p_Var2->content + 0x20) + lVar4 * 8) =
               *(undefined8 *)(*(long *)(*(long *)(*in_RDI + 0x20) + lVar6 * 8) + lVar5 * 8);
        }
        lVar4 = lVar3;
      }
    }
    *(long *)(*(long *)((long)p_Var2->content + 0x38) + (long)sunctx * 8) = lVar4;
  }
  return p_Var2;
}

Assistant:

SUNMatrix SUNSparseFromDenseMatrix(SUNMatrix Ad, sunrealtype droptol,
                                   int sparsetype)
{
  SUNFunctionBegin(Ad->sunctx);
  sunindextype i, j, nnz;
  sunindextype M, N;
  SUNMatrix As;

  SUNAssertNull(SUNMatGetID(Ad) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);
  SUNAssertNull(sparsetype == CSC_MAT || sparsetype == CSR_MAT,
                SUN_ERR_ARG_OUTOFRANGE);
  SUNAssertNull(droptol >= ZERO, SUN_ERR_ARG_OUTOFRANGE);

  /* set size of new matrix */
  M = SM_ROWS_D(Ad);
  N = SM_COLUMNS_D(Ad);

  /* determine total number of nonzeros */
  nnz = 0;
  for (j = 0; j < N; j++)
  {
    for (i = 0; i < M; i++)
    {
      nnz += (SUNRabs(SM_ELEMENT_D(Ad, i, j)) > droptol);
    }
  }

  /* allocate sparse matrix */
  As = NULL;
  As = SUNSparseMatrix(M, N, nnz, sparsetype, Ad->sunctx);
  SUNCheckLastErrNull();

  /* copy nonzeros from Ad into As, based on CSR/CSC type */
  nnz = 0;
  if (sparsetype == CSC_MAT)
  {
    for (j = 0; j < N; j++)
    {
      (SM_INDEXPTRS_S(As))[j] = nnz;
      for (i = 0; i < M; i++)
      {
        if (SUNRabs(SM_ELEMENT_D(Ad, i, j)) > droptol)
        {
          (SM_INDEXVALS_S(As))[nnz] = i;
          (SM_DATA_S(As))[nnz++]    = SM_ELEMENT_D(Ad, i, j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[N] = nnz;
  }
  else
  { /* CSR_MAT */
    for (i = 0; i < M; i++)
    {
      (SM_INDEXPTRS_S(As))[i] = nnz;
      for (j = 0; j < N; j++)
      {
        if (SUNRabs(SM_ELEMENT_D(Ad, i, j)) > droptol)
        {
          (SM_INDEXVALS_S(As))[nnz] = j;
          (SM_DATA_S(As))[nnz++]    = SM_ELEMENT_D(Ad, i, j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[M] = nnz;
  }

  return (As);
}